

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

void __thiscall
Potassco::SmodelsOutput::rule(SmodelsOutput *this,Head_t ht,AtomSpan *head,LitSpan *body)

{
  int iVar1;
  char *exp;
  uint line;
  int iVar2;
  char *fmt;
  AtomSpan local_30;
  
  if (this->sec_ != 0) {
    exp = "sec_ == 0";
    fmt = "adding rules after symbols not supported";
    line = 0x137;
LAB_0011a182:
    fail(-2,"virtual void Potassco::SmodelsOutput::rule(Head_t, const AtomSpan &, const LitSpan &)",
         line,exp,fmt,0);
  }
  if (head->size != 0) {
    iVar1 = 8;
    if (head->size == 1) {
      iVar1 = 1;
    }
    iVar2 = 3;
    if (ht.val_ != Choice) {
      iVar2 = iVar1;
    }
    std::ostream::operator<<((ostream *)this->os_,iVar2);
    add(this,ht,head);
    add(this,body);
    std::__ostream_insert<char,std::char_traits<char>>(this->os_,"\n",1);
    return;
  }
  if (ht.val_ != Choice) {
    if (this->false_ == 0) {
      exp = "false_ != 0";
      fmt = "empty head requires false atom";
      line = 0x13b;
      goto LAB_0011a182;
    }
    local_30.first = &this->false_;
    this->fHead_ = true;
    local_30.size = 1;
    rule(this,ht,&local_30,body);
  }
  return;
}

Assistant:

void SmodelsOutput::rule(Head_t ht, const AtomSpan& head, const LitSpan& body) {
	POTASSCO_REQUIRE(sec_ == 0, "adding rules after symbols not supported");
	if (empty(head)) {
		if (ht == Head_t::Choice) { return; }
		else {
			POTASSCO_REQUIRE(false_ != 0, "empty head requires false atom");
			fHead_ = true;
			return SmodelsOutput::rule(ht, toSpan(&false_, 1), body);
		}
	}
	SmodelsRule rt = (SmodelsRule)isSmodelsHead(ht, head);
	POTASSCO_REQUIRE(rt != End, "unsupported rule type");
	startRule(rt).add(ht, head).add(body).endRule();
}